

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_id_func.h
# Opt level: O1

void __thiscall
ArrayIDFunc<std::vector<int,_std::allocator<int>_>_>::~ArrayIDFunc
          (ArrayIDFunc<std::vector<int,_std::allocator<int>_>_> *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  void *pvVar3;
  long lVar4;
  
  pvVar1 = this->data_;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar2 = pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar2 != (pointer)0x0) {
      lVar4 = (long)piVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    return;
  }
  return;
}

Assistant:

~ArrayIDFunc() { delete[] data_; }